

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O0

void __thiscall
r_exec::IPGMContext::copy_member<r_exec::View>
          (IPGMContext *this,View *destination,uint16_t write_index,uint16_t *extent_index,
          bool dereference_cptr,int64_t pgm_index)

{
  View *view;
  Overlay *pOVar1;
  PGMOverlay *pPVar2;
  undefined1 uVar3;
  char cVar4;
  byte bVar5;
  uint16_t uVar6;
  ushort uVar7;
  int iVar8;
  undefined4 extraout_var;
  P *pPVar9;
  Code *pCVar10;
  Atom *pAVar11;
  Atom *pAVar12;
  uint *puVar13;
  undefined8 extraout_RDX;
  Atom local_194 [4];
  Atom local_190 [4];
  Atom local_18c [4];
  undefined1 local_188 [8];
  IPGMContext c_3;
  Atom local_124 [4];
  undefined1 local_120 [8];
  IPGMContext c_2;
  IPGMContext local_e8;
  Atom local_b8 [4];
  Atom local_b4 [4];
  undefined1 local_b0 [8];
  IPGMContext c;
  Atom local_6c [4];
  undefined1 local_68 [8];
  IPGMContext c_1;
  int64_t pgm_index_local;
  bool dereference_cptr_local;
  uint16_t *extent_index_local;
  uint16_t write_index_local;
  View *destination_local;
  IPGMContext *this_local;
  
  c_1.view = (View *)pgm_index;
  operator[](this,0);
  uVar3 = r_code::Atom::getDescriptor();
  puVar13 = &switchD_0029c690::switchdataD_002a5b20;
  switch(uVar3) {
  case 0x83:
    pAVar11 = operator[](this,0);
    pAVar12 = r_code::View::code(&destination->super_View,write_index);
    r_code::Atom::operator=(pAVar12,pAVar11);
    break;
  case 0x84:
  case 0x87:
  case 0x89:
    if (((this->super__Context).data == REFERENCE) && ((this->super__Context).index == 0)) {
      addReference(this,destination,write_index,this->object);
      return;
    }
    operator[](this,0);
    r_code::Atom::asIndex();
    cVar4 = r_code::Atom::getDescriptor();
    if (cVar4 == -0x40) {
      if (!dereference_cptr) {
LAB_0029c76e:
        pAVar11 = (this->super__Context).code;
        pCVar10 = this->object;
        view = this->view;
        operator[](this,0);
        uVar6 = r_code::Atom::asIndex();
        IPGMContext((IPGMContext *)local_68,pCVar10,view,pAVar11,uVar6,
                    (InputLessPGMOverlay *)(this->super__Context).overlay,
                    (this->super__Context).data);
        r_code::Atom::IPointer((ushort)local_6c);
        pAVar11 = r_code::View::code(&destination->super_View,write_index);
        r_code::Atom::operator=(pAVar11,local_6c);
        r_code::Atom::~Atom(local_6c);
        copy_structure<r_exec::View>
                  ((IPGMContext *)local_68,destination,*extent_index,extent_index,dereference_cptr,
                   (int64_t)c_1.view);
        ~IPGMContext((IPGMContext *)local_68);
        return;
      }
      if (0 < (long)c_1.view) {
        operator[](this,0);
        r_code::Atom::asIndex();
        uVar7 = r_code::Atom::asIndex();
        if ((long)c_1.view < (long)(ulong)uVar7) goto LAB_0029c76e;
      }
    }
    operator*((IPGMContext *)local_b0,this);
    operator[]((IPGMContext *)local_b0,0);
    bVar5 = r_code::Atom::isStructural();
    if ((bVar5 & 1) == 0) {
      pAVar11 = operator[]((IPGMContext *)local_b0,0);
      pAVar12 = r_code::View::code(&destination->super_View,write_index);
      r_code::Atom::operator=(pAVar12,pAVar11);
    }
    else {
      r_code::Atom::IPointer((ushort)local_b4);
      pAVar11 = r_code::View::code(&destination->super_View,write_index);
      r_code::Atom::operator=(pAVar11,local_b4);
      r_code::Atom::~Atom(local_b4);
      if (((0 < (long)c_1.view) && ((long)c_1.view < (long)(ulong)(this->super__Context).index)) &&
         ((this->super__Context).data == STEM)) {
        uVar6 = (this->super__Context).index;
        r_code::Atom::OutObjPointer((ushort)local_b8);
        _Context::patch_code(&this->super__Context,uVar6,local_b8);
        r_code::Atom::~Atom(local_b8);
      }
      copy_structure<r_exec::View>
                ((IPGMContext *)local_b0,destination,*extent_index,extent_index,dereference_cptr,
                 (int64_t)c_1.view);
    }
    ~IPGMContext((IPGMContext *)local_b0);
    break;
  case 0x85:
    pCVar10 = this->object;
    operator[](this,0);
    uVar7 = r_code::Atom::asIndex();
    iVar8 = (*(pCVar10->super__Object)._vptr__Object[9])
                      (pCVar10,(ulong)uVar7,extraout_RDX,
                       CONCAT62((int6)((ulong)puVar13 >> 0x10),uVar7));
    addReference(this,destination,write_index,(Code *)CONCAT44(extraout_var,iVar8));
    break;
  case 0x86:
    operator[](this,0);
    r_code::Atom::asIndex();
    uVar3 = r_code::Atom::getDescriptor();
    switch(uVar3) {
    case 0x84:
      operator[](this,0);
      r_code::Atom::asIndex();
      r_code::Atom::asIndex();
      cVar4 = r_code::Atom::getDescriptor();
      if (cVar4 == -0x78) {
        pPVar2 = (PGMOverlay *)(this->super__Context).overlay;
        operator[](this,0);
        r_code::Atom::asIndex();
        r_code::Atom::asIndex();
        bVar5 = r_code::Atom::asInputIndex();
        pCVar10 = PGMOverlay::getInputObject(pPVar2,(ushort)bVar5);
        addReference(this,destination,write_index,pCVar10);
      }
      else {
        operator*(&local_e8,this);
        copy_member<r_exec::View>
                  (&local_e8,destination,write_index,extent_index,dereference_cptr,(int64_t)c_1.view
                  );
        ~IPGMContext(&local_e8);
      }
      break;
    default:
      operator*((IPGMContext *)&c_3.view,this);
      copy_member<r_exec::View>
                ((IPGMContext *)&c_3.view,destination,write_index,extent_index,dereference_cptr,
                 (int64_t)c_1.view);
      ~IPGMContext((IPGMContext *)&c_3.view);
      break;
    case 0x88:
    case 0x8c:
      operator*((IPGMContext *)local_120,this);
      if ((short)c_2.super__Context.code == 0) {
        addReference(this,destination,write_index,(Code *)c_2.super__Context._24_8_);
      }
      else {
        operator[]((IPGMContext *)local_120,0);
        bVar5 = r_code::Atom::isStructural();
        if ((bVar5 & 1) == 0) {
          copy_member<r_exec::View>
                    ((IPGMContext *)local_120,destination,write_index,extent_index,dereference_cptr,
                     (int64_t)c_1.view);
        }
        else {
          r_code::Atom::IPointer((ushort)local_124);
          pAVar11 = r_code::View::code(&destination->super_View,write_index);
          r_code::Atom::operator=(pAVar11,local_124);
          r_code::Atom::~Atom(local_124);
          copy_structure<r_exec::View>
                    ((IPGMContext *)local_120,destination,*extent_index,extent_index,
                     dereference_cptr,(int64_t)c_1.view);
        }
      }
      ~IPGMContext((IPGMContext *)local_120);
      break;
    case 0x8a:
      pOVar1 = (this->super__Context).overlay;
      operator[](this,0);
      r_code::Atom::asIndex();
      uVar7 = r_code::Atom::asIndex();
      pPVar9 = (P *)std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::
                    operator[]((vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>
                                *)(pOVar1 + 1),(ulong)uVar7);
      pCVar10 = core::P::operator_cast_to_Code_(pPVar9);
      addReference(this,destination,write_index,pCVar10);
      break;
    case 0x8b:
      operator[](this,0);
      r_code::Atom::asIndex();
      uVar7 = r_code::Atom::asIndex();
      pAVar11 = (Atom *)((long)&c_2.view + 4);
      r_code::Atom::VLPointer((ushort)pAVar11,uVar7);
      pAVar12 = r_code::View::code(&destination->super_View,write_index);
      r_code::Atom::operator=(pAVar12,pAVar11);
      r_code::Atom::~Atom((Atom *)((long)&c_2.view + 4));
    }
    break;
  case 0x88:
    pPVar2 = (PGMOverlay *)(this->super__Context).overlay;
    operator[](this,0);
    uVar6 = r_code::Atom::asIndex();
    pCVar10 = PGMOverlay::getInputObject(pPVar2,uVar6);
    addReference(this,destination,write_index,pCVar10);
    break;
  case 0x8a:
    pOVar1 = (this->super__Context).overlay;
    operator[](this,0);
    uVar7 = r_code::Atom::asIndex();
    pPVar9 = (P *)std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::
                  operator[]((vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>
                              *)(pOVar1 + 1),(ulong)uVar7);
    pCVar10 = core::P::operator_cast_to_Code_(pPVar9);
    addReference(this,destination,write_index,pCVar10);
    break;
  default:
    pAVar11 = operator[](this,0);
    pAVar12 = r_code::View::code(&destination->super_View,write_index);
    r_code::Atom::operator=(pAVar12,pAVar11);
    if (((0 < (long)c_1.view) && ((long)c_1.view < (long)(ulong)(this->super__Context).index)) &&
       ((this->super__Context).data == STEM)) {
      uVar6 = (this->super__Context).index;
      r_code::Atom::OutObjPointer((ushort)local_194);
      _Context::patch_code(&this->super__Context,uVar6,local_194);
      r_code::Atom::~Atom(local_194);
    }
    break;
  case 0x8c:
    operator*((IPGMContext *)local_188,this);
    addReference(this,destination,write_index,(Code *)c_3.super__Context._24_8_);
    ~IPGMContext((IPGMContext *)local_188);
    break;
  case 0xc1:
  case 0xc2:
  case 0xc3:
  case 0xc4:
  case 0xc5:
  case 0xc6:
  case 199:
  case 200:
  case 0xc9:
  case 0xca:
  case 0xcb:
  case 0xcc:
  case 0xcd:
  case 0xce:
    r_code::Atom::IPointer((ushort)local_18c);
    pAVar11 = r_code::View::code(&destination->super_View,write_index);
    r_code::Atom::operator=(pAVar11,local_18c);
    r_code::Atom::~Atom(local_18c);
    if (((0 < (long)c_1.view) && ((long)c_1.view < (long)(ulong)(this->super__Context).index)) &&
       ((this->super__Context).data == STEM)) {
      uVar6 = (this->super__Context).index;
      r_code::Atom::OutObjPointer((ushort)local_190);
      _Context::patch_code(&this->super__Context,uVar6,local_190);
      r_code::Atom::~Atom(local_190);
    }
    copy_structure<r_exec::View>
              (this,destination,*extent_index,extent_index,dereference_cptr,(int64_t)c_1.view);
  }
  return;
}

Assistant:

void copy_member(C *destination,
                                       uint16_t write_index,
                                       uint16_t &extent_index,
                                       bool dereference_cptr,
                                       int64_t pgm_index) const
    {
        switch ((*this)[0].getDescriptor()) {
        case Atom::I_PTR:
        case Atom::VALUE_PTR:
        case Atom::IPGM_PTR: {
            if (data == REFERENCE && index == 0) { // points to an object, not to one of its members.
                addReference(destination, write_index, object);
                break;
            }

            if (code[(*this)[0].asIndex()].getDescriptor() == Atom::C_PTR) {
                if (!dereference_cptr || (pgm_index > 0 && code[(*this)[0].asIndex() + 1].asIndex() > pgm_index)) { // the latter case occurs when a cptr references code inside a pgm being copied.
                    IPGMContext c = IPGMContext(object, view, code, (*this)[0].asIndex(), (InputLessPGMOverlay *)overlay, data);
                    destination->code(write_index) = Atom::IPointer(extent_index);
                    c.copy_structure(destination, extent_index, extent_index, dereference_cptr, pgm_index);
                    break;
                }
            }

            IPGMContext c = **this;

            if (c[0].isStructural()) {
                destination->code(write_index) = Atom::IPointer(extent_index);

                if (pgm_index > 0 && index > pgm_index && data == STEM) {
                    this->patch_code(index, Atom::OutObjPointer(write_index));
                }

                c.copy_structure(destination, extent_index, extent_index, dereference_cptr, pgm_index);
            } else {
                destination->code(write_index) = c[0];
            }

            break;
        }

        case Atom::VL_PTR:
            switch (code[(*this)[0].asIndex()].getDescriptor()) {
            case Atom::PROD_PTR:
                addReference(destination, write_index, ((InputLessPGMOverlay *)overlay)->productions[code[(*this)[0].asIndex()].asIndex()]);
                break;

            case Atom::I_PTR:
                if (code[code[(*this)[0].asIndex()].asIndex()].getDescriptor() == Atom::IN_OBJ_PTR) {
                    addReference(destination, write_index, ((PGMOverlay *)overlay)->getInputObject(code[code[(*this)[0].asIndex()].asIndex()].asInputIndex()));
                } else {
                    (**this).copy_member(destination, write_index, extent_index, dereference_cptr, pgm_index);
                }

                break;

            case Atom::OUT_OBJ_PTR:
                destination->code(write_index) = Atom::VLPointer(code[(*this)[0].asIndex()].asIndex());
                break;

            case Atom::IN_OBJ_PTR:
            case Atom::D_IN_OBJ_PTR: {
                IPGMContext c = **this;

                if (c.index == 0) {
                    addReference(destination, write_index, c.object);
                } else if (c[0].isStructural()) {
                    destination->code(write_index++) = Atom::IPointer(extent_index);
                    c.copy_structure(destination, extent_index, extent_index, dereference_cptr, pgm_index);
                } else {
                    c.copy_member(destination, write_index, extent_index, dereference_cptr, pgm_index);
                }

                break;
            }

            default:
                (**this).copy_member(destination, write_index, extent_index, dereference_cptr, pgm_index);
                break;
            }

            break;

        case Atom::R_PTR:
            addReference(destination, write_index, object->get_reference((*this)[0].asIndex()));
            break;

        case Atom::PROD_PTR:
            addReference(destination, write_index, ((InputLessPGMOverlay *)overlay)->productions[(*this)[0].asIndex()]);
            break;

        case Atom::IN_OBJ_PTR:
            addReference(destination, write_index, ((PGMOverlay *)overlay)->getInputObject((*this)[0].asIndex()));
            break;

        case Atom::D_IN_OBJ_PTR: {
            IPGMContext c = **this;
            addReference(destination, write_index, c.object);
            break;
        }

        case Atom::OPERATOR:
        case Atom::OBJECT:
        case Atom::MARKER:
        case Atom::INSTANTIATED_PROGRAM:
        case Atom::INSTANTIATED_CPP_PROGRAM:
        case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
        case Atom::INSTANTIATED_ANTI_PROGRAM:
        case Atom::COMPOSITE_STATE:
        case Atom::MODEL:
        case Atom::GROUP:
        case Atom::SET:
        case Atom::S_SET:
        case Atom::TIMESTAMP:
        case Atom::STRING:
            destination->code(write_index) = Atom::IPointer(extent_index);

            if (pgm_index > 0 && index > pgm_index && data == STEM) {
                this->patch_code(index, Atom::OutObjPointer(write_index));
            }

            copy_structure(destination, extent_index, extent_index, dereference_cptr, pgm_index);
            break;

        case Atom::T_WILDCARD:
            destination->code(write_index) = (*this)[0];
            break;

        default:
            destination->code(write_index) = (*this)[0];

            if (pgm_index > 0 && index > pgm_index && data == STEM) {
                this->patch_code(index, Atom::OutObjPointer(write_index));
            }

            break;
        }
    }